

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

void __thiscall
duckdb_brotli::BrotliBootstrapFree(duckdb_brotli *this,void *address,MemoryManager *m)

{
  if (this != (duckdb_brotli *)0x0) {
    (**(code **)((long)address + 8))
              (*(undefined8 *)((long)address + 0x10),this,m,*(code **)((long)address + 8));
    return;
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliBootstrapFree(void* address, MemoryManager* m) {
  if (!address) {
    /* Should not happen! */
    return;
  } else {
    /* Copy values, as those would be freed. */
    brotli_free_func free_func = m->free_func;
    void* opaque = m->opaque;
    free_func(opaque, address);
  }
}